

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall EventComparisonNode::Evaluate(EventComparisonNode *this,Date *date,string *event_to)

{
  size_t sVar1;
  byte extraout_var;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  switch(this->comp) {
  case Less:
    std::__cxx11::string::compare((string *)event_to);
    bVar3 = (bool)(extraout_var >> 7);
    break;
  case LessOrEqual:
    iVar2 = std::__cxx11::string::compare((string *)event_to);
    bVar3 = iVar2 < 1;
    break;
  case Greater:
    iVar2 = std::__cxx11::string::compare((string *)event_to);
    bVar3 = 0 < iVar2;
    break;
  case GreaterOrEqual:
    iVar2 = std::__cxx11::string::compare((string *)event_to);
    bVar3 = -1 < iVar2;
    break;
  case Equal:
    sVar1 = event_to->_M_string_length;
    if (sVar1 == (this->event)._M_string_length) {
      if (sVar1 == 0) {
        return true;
      }
      iVar2 = bcmp((event_to->_M_dataplus)._M_p,(this->event)._M_dataplus._M_p,sVar1);
      return iVar2 == 0;
    }
    goto LAB_0010f6c8;
  case NotEqual:
    sVar1 = event_to->_M_string_length;
    if (sVar1 != (this->event)._M_string_length) {
      return true;
    }
    if (sVar1 != 0) {
      iVar2 = bcmp((event_to->_M_dataplus)._M_p,(this->event)._M_dataplus._M_p,sVar1);
      return iVar2 != 0;
    }
LAB_0010f6c8:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool EventComparisonNode::Evaluate(const Date &date, const string &event_to) const {
    switch (comp) {
        case Less:
            return event_to < event;
        case LessOrEqual:
            return event_to <= event;
        case Greater:
            return event_to > event;
        case GreaterOrEqual:
            return event_to >= event;
        case Equal:
            return event_to == event;
        case NotEqual:
            return event_to != event;
    }
    return true; // unreachable
}